

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O1

Abc_Ntk_t * Wlc_NtkGetInv(Wlc_Ntk_t *pNtk,Vec_Int_t *vInv,Vec_Str_t *vSop,int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pObj;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  char Buffer [5000];
  char local_13b8 [5000];
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  if ((pNtk->vCis).nSize < 1) {
    iVar11 = 0;
  }
  else {
    lVar12 = 0;
    uVar8 = 0;
    do {
      iVar11 = (pNtk->vCis).pArray[lVar12];
      lVar4 = (long)iVar11;
      if ((lVar4 < 1) || (pNtk->nObjsAlloc <= iVar11)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                      ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar1[lVar4] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        iVar2 = pWVar1[lVar4].End - pWVar1[lVar4].Beg;
        iVar11 = -iVar2;
        if (0 < iVar2) {
          iVar11 = iVar2;
        }
        uVar9 = iVar11 + 1;
        uVar10 = (ulong)uVar9;
        iVar11 = (int)uVar8;
        uVar5 = 0;
        do {
          if ((long)vInv->nSize <= (long)(uVar8 + uVar5)) goto LAB_0030292d;
        } while ((vInv->pArray[uVar8 + uVar5] == 0) && (uVar5 = uVar5 + 1, uVar10 != uVar5));
        if (uVar9 == (uint)uVar5) {
          uVar8 = (ulong)(uVar9 + iVar11);
        }
        else {
          uVar5 = 0;
          do {
            if (vInv->nSize <= (int)uVar8) {
LAB_0030292d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vInv->pArray[uVar8] != 0) {
              pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
              pcVar3 = Wlc_ObjName(pNtk,(int)((ulong)((long)pWVar1 +
                                                     (lVar4 * 0x18 - (long)pNtk->pObjs)) >> 3) *
                                        -0x55555555);
              sprintf(local_13b8,"%s[%d]",pcVar3,uVar5);
              Abc_ObjAssignName(pAVar6,local_13b8,(char *)0x0);
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar8 = uVar8 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          uVar8 = (ulong)(uVar9 + iVar11);
        }
      }
      iVar11 = (int)uVar8;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pNtk->vCis).nSize);
  }
  if (vInv->nSize != iVar11) {
    __assert_fail("Vec_IntSize(vInv) == nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcAbc.c"
                  ,0x87,"Abc_Ntk_t *Wlc_NtkGetInv(Wlc_Ntk_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
  pVVar7 = pNtk_00->vPis;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)pVVar7->pArray[lVar12]);
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk_00->vPis;
    } while (lVar12 < pVVar7->nSize);
  }
  pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtk_00->pManFunc,vSop->pArray);
  (pAVar6->field_5).pData = pcVar3;
  pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAddFanin(pObj,pAVar6);
  Abc_ObjAssignName(pObj,"inv",(char *)0x0);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Abc_Ntk_t * pMainNtk = NULL;
    Abc_Obj_t * pMainObj, * pMainTemp;
    char Buffer[5000];
    // start the network
    pMainNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pMainNtk->pName = Extra_UtilStrsav(pNtk->pName);
    // create primary inputs
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vInv, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        //printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vInv, nBits + k );
            if ( nNum == 0 )
                continue;
            //printf( "  [%d] -> %d", k, nNum );
            pMainObj = Abc_NtkCreatePi( pMainNtk );
            sprintf( Buffer, "%s[%d]", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k );
            Abc_ObjAssignName( pMainObj, Buffer, NULL );

        }
        //printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vInv), nBits );
    assert( Vec_IntSize(vInv) == nBits );
    // create node
    pMainObj = Abc_NtkCreateNode( pMainNtk );
    Abc_NtkForEachPi( pMainNtk, pMainTemp, i )
        Abc_ObjAddFanin( pMainObj, pMainTemp );
    pMainObj->pData = Abc_SopRegister( (Mem_Flex_t *)pMainNtk->pManFunc, Vec_StrArray(vSop) );
    // create PO
    pMainTemp = Abc_NtkCreatePo( pMainNtk );
    Abc_ObjAddFanin( pMainTemp, pMainObj );
    Abc_ObjAssignName( pMainTemp, "inv", NULL );
    return pMainNtk;
}